

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O3

UBool __thiscall icu_63::UVector::removeAll(UVector *this,UVector *other)

{
  int32_t index;
  void *pvVar1;
  UBool UVar2;
  long lVar3;
  
  if (other->count < 1) {
    UVar2 = '\0';
  }
  else {
    lVar3 = 0;
    UVar2 = '\0';
    do {
      index = indexOf(this,other->elements[lVar3],0,'\0');
      if (-1 < index) {
        pvVar1 = orphanElementAt(this,index);
        UVar2 = '\x01';
        if ((pvVar1 != (void *)0x0) && (this->deleter != (UObjectDeleter *)0x0)) {
          (*this->deleter)(pvVar1);
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < other->count);
  }
  return UVar2;
}

Assistant:

UBool UVector::removeAll(const UVector& other) {
    UBool changed = FALSE;
    for (int32_t i=0; i<other.size(); ++i) {
        int32_t j = indexOf(other.elements[i]);
        if (j >= 0) {
            removeElementAt(j);
            changed = TRUE;
        }
    }
    return changed;
}